

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O3

void __thiscall
GF2::Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::_Update
          (Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *this,
          iterator posPoly)

{
  size_t *psVar1;
  Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *pBVar2;
  _CPs *this_00;
  iterator iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _I *p_Var6;
  ulong uVar7;
  _Self __tmp;
  _List_node_base *p_Var8;
  _CPs *p_Var9;
  _List_node_base *p_Var10;
  CritPair<8UL,_GF2::MOGrevlex<8UL>_> newpair;
  undefined1 local_a0 [24];
  Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *local_88;
  _I *local_80;
  _List_node_base *local_78;
  _CPs *local_70;
  _List_node_base *local_68;
  _List_node_base *p_Stack_60;
  _List_node_base *local_58;
  _List_node_base *p_Stack_50;
  _List_node_base *local_48 [3];
  
  p_Var9 = &this->_pairs;
  p_Var8 = (this->_pairs).
           super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_88 = this;
  while (p_Var8 != (_List_node_base *)p_Var9) {
    if ((((ulong)posPoly._M_node[1]._M_next[1]._M_next & ~(ulong)p_Var8[3]._M_prev) == 0) &&
       (((ulong)p_Var8[3]._M_next & ~(ulong)p_Var8[2]._M_next) != 0)) {
      p_Var5 = p_Var8->_M_next;
      psVar1 = &(this->_pairs).
                super__List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var8,0x40);
      psVar1 = &(this->_stat).a_criterion;
      *psVar1 = *psVar1 + 1;
      p_Var8 = p_Var5;
    }
    else {
      p_Var8 = p_Var8->_M_next;
    }
  }
  local_a0._0_8_ = local_a0;
  local_a0._16_8_ = 0;
  p_Var8 = (_List_node_base *)&local_88->_basis;
  iVar3._M_node =
       (local_88->_basis).
       super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       .
       super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a0._8_8_ = local_a0._0_8_;
  local_78 = p_Var8;
  local_70 = p_Var9;
  if (iVar3._M_node != p_Var8) {
    p_Var5 = posPoly._M_node + 1;
    local_80 = &local_88->_reserve;
    local_48[2] = p_Var5;
    do {
      if (iVar3._M_node == posPoly._M_node) {
LAB_00137209:
        iVar3._M_node = (iVar3._M_node)->_M_next;
      }
      else {
        if (((ulong)(((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var5->_M_next)->
                    super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                    super__List_node_base._M_next[1]._M_next &
            ~(ulong)iVar3._M_node[1]._M_next[1]._M_next) != 0) {
          MP<8ul,GF2::MOGrevlex<8ul>>::ModGB<GF2::MOGrevlex<8ul>>
                    ((MP<8ul,GF2::MOGrevlex<8ul>> *)(iVar3._M_node + 1),
                     (MP<8UL,_GF2::MOGrevlex<8UL>_> *)p_Var5);
          goto LAB_00137209;
        }
        p_Var10 = (iVar3._M_node)->_M_next;
        iVar3 = MI<8UL,_GF2::MOGrevlex<8UL>_>::Splice(local_80,p_Var8,iVar3);
        p_Var8 = iVar3._M_node[1]._M_next[1]._M_next;
        p_Var5 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var5->_M_next)->
                 super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next[1]._M_next;
        p_Var4 = (_List_node_base *)operator_new(0x40);
        p_Var4[1]._M_next = (_List_node_base *)0xffffffffffffffff;
        p_Var4[1]._M_prev = iVar3._M_node;
        p_Var4[2]._M_next = p_Var8;
        p_Var4[2]._M_prev = posPoly._M_node;
        p_Var4[3]._M_next = p_Var5;
        p_Var4[3]._M_prev = (_List_node_base *)((ulong)p_Var5 | (ulong)p_Var8);
        std::__detail::_List_node_base::_M_hook(p_Var4);
        local_a0._16_8_ = local_a0._16_8_ + 1;
        psVar1 = &(local_88->_stat).r_criterion;
        *psVar1 = *psVar1 + 1;
        p_Var5 = local_48[2];
        p_Var9 = local_70;
        p_Var8 = local_78;
        iVar3._M_node = p_Var10;
      }
    } while (iVar3._M_node != p_Var8);
  }
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::sort((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          *)local_a0);
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::merge(p_Var9,(list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  *)local_a0);
  p_Var8 = (_List_node_base *)0x0;
  do {
    p_Var5 = posPoly._M_node[1]._M_next[1]._M_next;
    p_Var10 = (_List_node_base *)(1L << ((byte)p_Var8 & 0x3f));
    if (((ulong)p_Var5 >> ((ulong)p_Var8 & 0x3f) & 1) != 0) {
      p_Var4 = (_List_node_base *)operator_new(0x40);
      p_Var4[1]._M_next = p_Var8;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = p_Var10;
      p_Var4[2]._M_prev = posPoly._M_node;
      p_Var4[3]._M_next = p_Var5;
      p_Var4[3]._M_prev = (_List_node_base *)((ulong)p_Var10 | (ulong)p_Var5);
      std::__detail::_List_node_base::_M_hook(p_Var4);
      local_a0._16_8_ = local_a0._16_8_ + 1;
    }
    pBVar2 = local_88;
    p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1);
  } while (p_Var8 != (_List_node_base *)0x8);
  p_Var8 = local_78->_M_next;
  p_Var5 = (_List_node_base *)local_a0._0_8_;
  p_Var9 = local_70;
  if (p_Var8 != local_78) {
    local_80 = (_I *)&(local_88->_stat).b_criterion;
    p_Var10 = local_78;
    do {
      if (p_Var8 != posPoly._M_node) {
        local_68 = (_List_node_base *)0xffffffffffffffff;
        p_Stack_60 = p_Var8;
        local_58 = p_Var8[1]._M_next[1]._M_next;
        p_Stack_50 = posPoly._M_node;
        local_48[0] = posPoly._M_node[1]._M_next[1]._M_next;
        local_48[1] = (_List_node_base *)((ulong)local_48[0] | (ulong)local_58);
        p_Var5 = (_List_node_base *)local_a0._0_8_;
        p_Var6 = local_80;
        p_Var10 = local_78;
        while (p_Var4 = (_List_node_base *)local_a0._0_8_, local_80 = p_Var6, local_78 = p_Var10,
              p_Var5 != (_List_node_base *)local_a0) {
          p_Var4 = p_Var5[1]._M_next;
          if (((p_Var4 == (_List_node_base *)0xffffffffffffffff || p_Var4 == local_68) &&
              (((ulong)p_Var5[3]._M_prev & ~(ulong)local_48[1]) == 0)) &&
             (((ulong)posPoly._M_node[1]._M_next[1]._M_next &
              ~((ulong)p_Var8[1]._M_next[1]._M_next | (ulong)p_Var5[2]._M_next)) != 0)) {
            if ((p_Var4 != local_68) || (p_Var5[3]._M_prev != local_48[1])) goto LAB_00137529;
            psVar1 = &(pBVar2->_stat).c_criterion;
            *psVar1 = *psVar1 + 1;
            if (p_Var4 == (_List_node_base *)0xffffffffffffffff) {
              if (((ulong)p_Var5[2]._M_next & (ulong)p_Var5[3]._M_next) == 0) goto LAB_00137531;
              uVar7 = (ulong)local_48[0] & (ulong)local_58;
            }
            else {
              if (((ulong)(&p_Var5[3]._M_next)[(ulong)p_Var4 >> 6] >> ((ulong)p_Var4 & 0x3f) & 1) ==
                  0) goto LAB_00137531;
              uVar7 = 1L << ((byte)p_Var4 & 0x3f) & (ulong)local_48[(ulong)p_Var4 >> 6];
            }
            if (uVar7 != 0) goto LAB_00137531;
            p_Var10 = p_Var5->_M_next;
            local_a0._16_8_ = local_a0._16_8_ - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var5,0x40);
            p_Var5 = p_Var10;
            p_Var6 = local_80;
            p_Var10 = local_78;
          }
          else {
            p_Var5 = (((_List_base<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          }
        }
        while (p_Var4 != (_List_node_base *)local_a0) {
          if (((local_68 == (_List_node_base *)0xffffffffffffffff) ||
              (local_68 == p_Var4[1]._M_next)) &&
             ((((ulong)local_48[1] & ~(ulong)p_Var4[3]._M_prev) == 0 &&
              ((local_48[1] != p_Var4[3]._M_prev || local_68 != p_Var4[1]._M_next &&
               (((ulong)posPoly._M_node[1]._M_next[1]._M_next &
                ~((ulong)p_Var8[1]._M_next[1]._M_next | (ulong)p_Var4[2]._M_next)) != 0)))))) {
            p_Var5 = p_Var4->_M_next;
            local_a0._16_8_ = local_a0._16_8_ - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var4,0x40);
            (local_80->
            super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ).
            super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next =
                 (_List_node_base *)
                 ((long)&((local_80->
                          super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          ).
                          super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 1);
            p_Var4 = p_Var5;
          }
          else {
            p_Var4 = p_Var4->_M_next;
          }
        }
        p_Var5 = (_List_node_base *)operator_new(0x40);
        p_Var5[1]._M_next = local_68;
        p_Var5[1]._M_prev = p_Stack_60;
        p_Var5[2]._M_next = local_58;
        p_Var5[2]._M_prev = p_Stack_50;
        p_Var5[3]._M_next = local_48[0];
        p_Var5[3]._M_prev = local_48[1];
        std::__detail::_List_node_base::_M_hook(p_Var5);
        p_Var6 = (_I *)(local_a0 + 0x10);
LAB_00137529:
        (p_Var6->
        super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
        ).
        super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next =
             (_List_node_base *)
             ((long)&((p_Var6->
                      super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      ).
                      super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next)->_M_next + 1);
        p_Var10 = local_78;
      }
LAB_00137531:
      p_Var8 = p_Var8->_M_next;
      p_Var5 = (_List_node_base *)local_a0._0_8_;
      p_Var9 = local_70;
    } while (p_Var8 != p_Var10);
  }
  while (this_00 = local_70, local_70 = p_Var9, p_Var5 != (_List_node_base *)local_a0) {
    p_Var8 = p_Var5[1]._M_next;
    if (p_Var8 == (_List_node_base *)0xffffffffffffffff) {
      uVar7 = (ulong)p_Var5[3]._M_next & (ulong)p_Var5[2]._M_next;
    }
    else {
      uVar7 = 1L << ((byte)p_Var8 & 0x3f) & (ulong)(&p_Var5[3]._M_next)[(ulong)p_Var8 >> 6];
    }
    if (uVar7 == 0) {
      psVar1 = &(pBVar2->_stat).buch_criterion;
      *psVar1 = *psVar1 + 1;
      p_Var8 = p_Var5->_M_next;
      local_a0._16_8_ = local_a0._16_8_ - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x40);
      p_Var5 = p_Var8;
      p_Var9 = local_70;
      local_70 = this_00;
    }
    else {
      p_Var5 = p_Var5->_M_next;
      local_70 = this_00;
    }
  }
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::sort((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          *)local_a0);
  std::__cxx11::
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  ::merge(this_00,(list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   *)local_a0);
  p_Var8 = (_List_node_base *)local_a0._0_8_;
  while (p_Var8 != (_List_node_base *)local_a0) {
    p_Var5 = p_Var8->_M_next;
    operator_delete(p_Var8,0x40);
    p_Var8 = p_Var5;
  }
  return;
}

Assistant:

void _Update(typename _I::iterator posPoly)
	{
		// критерий A:
		// если LM(poly) | [LM(f_i), LM(f_j)] и (f_i, f_j) не является r-парой,
		// то (f_i, f_j) можно исключить
		auto posPair = _pairs.begin();
		for (; posPair != _pairs.end();)
			if ((posPoly->LM() | posPair->lcm) && !posPair->IsRPair())
				posPair = _pairs.erase(posPair), _stat.a_criterion++;
			else 
				++posPair;

		// формируем r-пары (f_i, poly), где LM(poly) | LM(f_i)
		// удаляем многочлены f_i
		// .
		// если LM(poly) \not| LM(f_i), то LM(poly) \neq LM(f_i)
		// поэтому LM(f_i mod poly) == LM(f_i) и f_i можно заменить 
		// на f_i mod poly без изменения характеристики lcm всех S-многочленов,
		// в которые входит f_i
		_CPs newpairs;
		// цикл по многочленам базиса
		_Iterator posBasis = _basis.begin();
		for (; posBasis != _basis.end();)
		{
			if (posPoly == posBasis)
			{
				++posBasis;
				continue;
			}
			// подходящий для r-пары многочлен *posBasis?
			if (posPoly->LM() | posBasis->LM())
			{
				// переводим многочлен в резерв
				_Iterator posReserve = _reserve.Splice(_basis, posBasis++);
				// добавляем новую критическую пару
				newpairs.push_front(_CP(posReserve, posPoly));
				_stat.r_criterion++;
			}
			// упрощаем *posBasis
			else posBasis->Mod(*posPoly), ++posBasis;
		}
		// добавляем r-пары в список критических пар
		newpairs.sort();
		_pairs.merge(newpairs);

		// добавляем пары (x_i^2 - x_i, poly)  
		// с учетом первого критерия Бухбергера рассматриваем только
		// такие i, что LM(poly) содержит x_i
		for (size_t var = 0; var < _n; var++)
			// есть зацепление?
			if (posPoly->LM().Test(var))
				newpairs.push_front(_CP(var, posPoly));

		// добавляем пары (f, poly), f -- явные многочлены _basis, 
		// в список пар с учетом критериев B, С:
		// если в _basis найдется f_i т.ч. 
		// [LM(f_i), LM(poly)] | [LM(f_j), LM(poly)],
		// и LM(poly) не делит [LM(f_i), LM(f_j)] или одна из пар (f_i, f_j), 
		// (f_j,f_i) уже обработана, то 
		// a) пару (f_j, poly) можно исключить, 
		//    если [LM(f_i), LM(poly)] != [LM(f_j), LM(poly)] (критерий B);
		// б) одну из пар (f_i, poly), (f_j, poly) можно исключить,
		//    если [LM(f_i), LM(poly)] == [LM(f_j), LM(poly)] (критерий С);
		// .
		// важно: f_i не может быть уравнением поля
		// важно: при применении критерия С в первую очередь исключается пара
		//		  с зацеплением
		// важно: (f_j, poly) не может быть r-парой
		for (posBasis = _basis.begin(); posBasis != _basis.end(); ++posBasis)
		{
			if (posBasis == posPoly) continue;
			// добавляемая пара
			_CP newpair(posBasis, posPoly);
			// цикл по имеющимся парам
			posPair = newpairs.begin();
			for (; posPair != newpairs.end();)
			{
				// выполняются условия делимости?
				if ((*posPair | newpair) && 
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
				{
					// новая пара исключается критерием B?
					if (*posPair != newpair)
					{
						_stat.b_criterion++;
						break;
					}
					// действует критерий C
					_stat.c_criterion++;
					// новая пара исключается критерием C?
					if (posPair->IsRelPrime() || !newpair.IsRelPrime())
						break;
					// новая пара исключает пару *posPair по критерию C
					posPair = newpairs.erase(posPair);
				}
				else
					++posPair;
			}
			// пара исключена критерием B или С? к следующей
			if (posPair != newpairs.end()) 
				continue;
			// снова цикл по имеющимся парам: пробуем их исключить
			for (posPair = newpairs.begin(); posPair != newpairs.end();)
				// критерий B исключает *posPair?
				if ((newpair | *posPair) && newpair != *posPair &&
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
						posPair = newpairs.erase(posPair), _stat.b_criterion++;
				else
					++posPair;
			// добавляем пару
			newpairs.insert(posPair, newpair);
		}
		// применяем первый критерий Бухбергера: удаляем пары без зацепления
		for (posPair = newpairs.begin(); posPair != newpairs.end();)
			if (posPair->IsRelPrime())
				_stat.buch_criterion++,
				posPair = newpairs.erase(posPair);
			else
				++posPair;
		// слияние списков пар
		newpairs.sort();
		_pairs.merge(newpairs);
	}